

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

Value * __thiscall
choc::value::createObject(Value *__return_storage_ptr__,value *this,string_view className)

{
  undefined8 __ptr;
  Allocator *pAVar1;
  Object *pOVar2;
  char *__dest;
  Value *pVVar3;
  Value *extraout_RAX;
  size_type size;
  Type local_48;
  
  pOVar2 = (Object *)malloc(0x28);
  __dest = (char *)malloc((size_t)(this + 1));
  memcpy(__dest,(void *)className._M_len,(size_t)this);
  __dest[(long)this] = '\0';
  (pOVar2->className)._M_len = (size_t)this;
  (pOVar2->className)._M_str = __dest;
  (pOVar2->members).allocator = (Allocator *)0x0;
  (pOVar2->members).items = (MemberNameAndType *)0x0;
  (pOVar2->members).size = 0;
  (pOVar2->members).capacity = 0;
  local_48.mainType = object;
  local_48.allocator = (Allocator *)0x0;
  local_48.content.object = pOVar2;
  Value::Value(__return_storage_ptr__,&local_48);
  pAVar1 = local_48.allocator;
  __ptr = local_48.content.object;
  pVVar3 = (Value *)(ulong)local_48.mainType;
  if ((char)local_48.mainType < '\0') {
    if (local_48.mainType == object) {
      if (local_48.content.object == (Object *)0x0) {
        return pVVar3;
      }
      Type::Object::~Object(local_48.content.object);
    }
    else {
      if (local_48.mainType != complexArray) {
        return pVVar3;
      }
      if (local_48.content.object == (Object *)0x0) {
        return pVVar3;
      }
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_48.content.object);
    }
    if (pAVar1 == (Allocator *)0x0) {
      free((void *)__ptr);
      pVVar3 = extraout_RAX;
    }
    else {
      pVVar3 = (Value *)(**(code **)(*(long *)pAVar1 + 0x20))(pAVar1,__ptr);
    }
  }
  return pVVar3;
}

Assistant:

inline Value createObject (std::string_view className)
{
    return Value (Type::createObject (className));
}